

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O2

uint64_t basisu::color_cell_compression_est_astc
                   (uint32_t num_weights,uint32_t num_comps,uint32_t *pWeight_table,
                   uint32_t num_pixels,color_quad_u8 *pPixels,uint64_t best_err_so_far,
                   uint32_t *weights)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint8_t auVar5 [4];
  uint32_t uVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int j_1;
  int iVar14;
  int iVar15;
  uint32_t i_8;
  ulong uVar16;
  int j_3;
  uint32_t i_1;
  undefined1 in_XMM0 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  undefined1 in_XMM1 [16];
  uint uVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar26;
  uint uVar27;
  undefined1 in_XMM2 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar28 [16];
  color_quad_u8 weightedColors [32];
  int iStack_16c;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int thresh [31];
  int dots [32];
  
  if (1 < num_comps - 3) {
    __assert_fail("num_comps == 3 || num_comps == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6ef,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  if (0x1f < num_weights - 1) {
    __assert_fail("num_weights >= 1 && num_weights <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6f0,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  if ((*pWeight_table != 0) || (uVar8 = (ulong)(num_weights - 1), pWeight_table[uVar8] != 0x40)) {
    __assert_fail("pWeight_table[0] == 0 && pWeight_table[num_weights - 1] == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6f1,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  if (num_comps == 4) {
    auVar24 = pmovzxbd(in_XMM2,0xffffffff);
    auVar19 = (undefined1  [16])0x0;
    for (uVar11 = 0; num_pixels != uVar11; uVar11 = uVar11 + 1) {
      in_XMM0 = pmovzxbd(in_XMM0,*(undefined4 *)pPixels[uVar11].m_c);
      uVar10 = in_XMM0._0_4_;
      uVar23 = auVar24._0_4_;
      auVar28._0_4_ = (uVar10 < uVar23) * uVar10 | (uVar10 >= uVar23) * uVar23;
      uVar23 = in_XMM0._4_4_;
      uVar26 = auVar24._4_4_;
      auVar28._4_4_ = (uVar23 < uVar26) * uVar23 | (uVar23 >= uVar26) * uVar26;
      uVar26 = in_XMM0._8_4_;
      uVar27 = auVar24._8_4_;
      uVar20 = auVar24._12_4_;
      auVar28._8_4_ = (uVar26 < uVar27) * uVar26 | (uVar26 >= uVar27) * uVar27;
      uVar27 = in_XMM0._12_4_;
      auVar28._12_4_ = (uVar27 < uVar20) * uVar27 | (uVar27 >= uVar20) * uVar20;
      uVar20 = auVar19._0_4_;
      auVar17._0_4_ = (uVar20 < uVar10) * uVar10 | (uVar20 >= uVar10) * uVar20;
      uVar10 = auVar19._4_4_;
      auVar17._4_4_ = (uVar10 < uVar23) * uVar23 | (uVar10 >= uVar23) * uVar10;
      uVar10 = auVar19._8_4_;
      uVar23 = auVar19._12_4_;
      auVar17._8_4_ = (uVar10 < uVar26) * uVar26 | (uVar10 >= uVar26) * uVar10;
      auVar17._12_4_ = (uVar23 < uVar27) * uVar27 | (uVar23 >= uVar27) * uVar23;
      auVar19 = auVar17;
      auVar24 = auVar28;
    }
  }
  else {
    uVar23 = 0xff;
    uVar27 = 0;
    uVar26 = 0;
    uVar11 = 0;
    uVar10 = 0xff;
    uVar9 = 0xff;
    for (uVar12 = 0; num_pixels != uVar12; uVar12 = uVar12 + 1) {
      bVar1 = pPixels[uVar12].m_c[0];
      if ((uint)bVar1 <= (uint)uVar9) {
        uVar9 = (ulong)(uint)bVar1;
      }
      bVar2 = pPixels[uVar12].m_c[1];
      if (bVar2 <= uVar10) {
        uVar10 = (uint)bVar2;
      }
      bVar3 = pPixels[uVar12].m_c[2];
      if (bVar3 <= uVar23) {
        uVar23 = (uint)bVar3;
      }
      if ((uint)uVar11 <= (uint)bVar1) {
        uVar11 = (ulong)(uint)bVar1;
      }
      if (uVar26 <= bVar2) {
        uVar26 = (uint)bVar2;
      }
      if (uVar27 <= bVar3) {
        uVar27 = (uint)bVar3;
      }
    }
    auVar19 = pmovzxbd(in_XMM1,0xffffffff);
    auVar24._8_8_ = auVar19._8_8_ & 0xffffffff00000000 | (ulong)uVar23;
    auVar24._0_8_ = uVar9 | (ulong)uVar10 << 0x20;
    auVar19._8_8_ = auVar19._8_8_ & 0xffffffff00000000 | (ulong)uVar27;
    auVar19._0_8_ = uVar11 | (ulong)uVar26 << 0x20;
  }
  auVar17 = pmovzxbd(in_XMM0,0xffffffff);
  auVar28 = auVar24 & auVar17;
  auVar5 = (uint8_t  [4])
           ((uint)auVar24[4] << 8 | (uint)auVar24[8] << 0x10 | (uint)auVar24[0xc] << 0x18 |
           (uint)auVar24[0]);
  weightedColors[0].m_c[0] = auVar5[0];
  weightedColors[0].m_c[1] = auVar5[1];
  weightedColors[0].m_c[2] = auVar5[2];
  weightedColors[0].m_c[3] = auVar5[3];
  auVar17 = auVar17 & auVar19;
  *(uint *)weightedColors[uVar8].m_c =
       (uint)auVar19[4] << 8 | (uint)auVar19[8] << 0x10 | (uint)auVar19[0xc] << 0x18 |
       (uint)auVar19[0];
  for (uVar11 = 1; uVar11 < uVar8; uVar11 = uVar11 + 1) {
    uVar7 = pWeight_table[uVar11];
    uVar6 = astc_interpolate_linear((uint)auVar24[0],(uint)auVar19[0],uVar7);
    weightedColors[uVar11].m_c[0] = (uint8_t)uVar6;
    uVar6 = astc_interpolate_linear((uint)auVar24[4],(uint)auVar19[4],uVar7);
    weightedColors[uVar11].m_c[1] = (uint8_t)uVar6;
    uVar6 = astc_interpolate_linear((uint)auVar24[8],(uint)auVar19[8],uVar7);
    weightedColors[uVar11].m_c[2] = (uint8_t)uVar6;
    uVar4 = 0xff;
    if (num_comps == 4) {
      uVar7 = astc_interpolate_linear((uint)auVar24[0xc],(uint)auVar19[0xc],uVar7);
      uVar4 = (uint8_t)uVar7;
    }
    weightedColors[uVar11].m_c[3] = uVar4;
  }
  local_148 = auVar17._0_4_;
  iStack_144 = auVar17._4_4_;
  iStack_140 = auVar17._8_4_;
  iStack_13c = auVar17._12_4_;
  local_158 = auVar28._0_4_;
  iStack_154 = auVar28._4_4_;
  iStack_150 = auVar28._8_4_;
  iStack_14c = auVar28._12_4_;
  auVar18._0_4_ = local_148 - local_158;
  auVar18._4_4_ = iStack_144 - iStack_154;
  auVar18._8_4_ = iStack_140 - iStack_150;
  auVar18._12_4_ = iStack_13c - iStack_14c;
  if (num_comps == 4) {
    auVar19 = auVar18;
    for (uVar11 = 0; num_weights != uVar11; uVar11 = uVar11 + 1) {
      auVar19 = pmovzxbd(auVar19,*(undefined4 *)weightedColors[uVar11].m_c);
      auVar19 = pmaddwd(auVar19,auVar18);
      auVar19 = phaddd(auVar19,auVar19);
      auVar19 = phaddd(auVar19,auVar19);
      dots[uVar11] = auVar19._0_4_;
    }
  }
  else {
    iStack_15c = auVar19._12_4_;
    iStack_16c = auVar24._12_4_;
    if (iStack_15c != iStack_16c) {
      __assert_fail("aa == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                    ,0x736,
                    "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                   );
    }
    for (uVar11 = 0; num_weights != uVar11; uVar11 = uVar11 + 1) {
      dots[uVar11] = (uint)weightedColors[uVar11].m_c[2] * auVar18._8_4_ +
                     (uint)weightedColors[uVar11].m_c[1] * auVar18._4_4_ +
                     (uint)weightedColors[uVar11].m_c[0] * auVar18._0_4_;
    }
  }
  for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
    thresh[uVar11] = dots[uVar11] + dots[uVar11 + 1] + 1 >> 1;
  }
  auVar19 = *(undefined1 (*) [16])weights;
  auVar21._0_8_ = auVar19._8_8_;
  auVar21._8_4_ = auVar19._8_4_;
  auVar21._12_4_ = auVar19._12_4_;
  auVar21 = auVar21 | auVar19;
  uVar11 = (ulong)(num_weights - 2);
  if ((auVar21._4_4_ | auVar21._0_4_) == 1) {
    if (num_comps == 4) {
      uVar10 = 0;
      uVar9 = 0;
      do {
        if (uVar10 == num_pixels) {
          return uVar9;
        }
        auVar19 = pmovzxbd(auVar19,*(undefined4 *)pPixels[uVar10].m_c);
        auVar24 = pmaddwd(auVar18,auVar19);
        auVar17 = phaddd(auVar24,auVar24);
        uVar12 = uVar8;
        for (uVar16 = uVar11; -1 < (int)uVar16; uVar16 = (ulong)((int)uVar16 - 1)) {
          if (thresh[uVar16] <= auVar24._12_4_ + auVar24._8_4_ + auVar17._0_4_) goto LAB_0020d2b0;
          uVar12 = uVar12 - 1;
        }
        uVar12 = 0;
LAB_0020d2b0:
        auVar24 = pmovzxbd(auVar17,*(undefined4 *)weightedColors[uVar12].m_c);
        auVar22._0_4_ = auVar24._0_4_ - auVar19._0_4_;
        auVar22._4_4_ = auVar24._4_4_ - auVar19._4_4_;
        auVar22._8_4_ = auVar24._8_4_ - auVar19._8_4_;
        auVar22._12_4_ = auVar24._12_4_ - auVar19._12_4_;
        auVar24 = pmulld(auVar22,auVar22);
        auVar24 = phaddd(auVar24,auVar24);
        auVar24 = phaddd(auVar24,auVar24);
        uVar9 = uVar9 + auVar24._0_4_;
        uVar10 = uVar10 + 1;
      } while (uVar9 <= best_err_so_far);
    }
    else {
      uVar10 = 0;
      uVar9 = 0;
      do {
        if (uVar10 == num_pixels) {
          return uVar9;
        }
        uVar16 = uVar8;
        for (uVar12 = uVar11; -1 < (int)uVar12; uVar12 = (ulong)((int)uVar12 - 1)) {
          if (thresh[uVar12] <=
              (int)(auVar18._8_4_ * (uint)pPixels[uVar10].m_c[2] +
                   auVar18._4_4_ * (uint)pPixels[uVar10].m_c[1] +
                   auVar18._0_4_ * (uint)pPixels[uVar10].m_c[0])) goto LAB_0020d3db;
          uVar16 = uVar16 - 1;
        }
        uVar16 = 0;
LAB_0020d3db:
        iVar13 = (uint)weightedColors[uVar16].m_c[0] - (uint)pPixels[uVar10].m_c[0];
        iVar14 = (uint)weightedColors[uVar16].m_c[1] - (uint)pPixels[uVar10].m_c[1];
        iVar15 = (uint)weightedColors[uVar16].m_c[2] - (uint)pPixels[uVar10].m_c[2];
        uVar9 = uVar9 + (uint)(iVar15 * iVar15 + iVar14 * iVar14 + iVar13 * iVar13);
        uVar10 = uVar10 + 1;
      } while (uVar9 <= best_err_so_far);
    }
  }
  else if (num_comps == 4) {
    uVar9 = 0;
    uVar10 = 0;
    do {
      if (uVar10 == num_pixels) {
        return uVar9;
      }
      auVar24 = pmovzxbd(auVar21,*(undefined4 *)pPixels[uVar10].m_c);
      auVar17 = pmaddwd(auVar18,auVar24);
      auVar28 = phaddd(auVar17,auVar17);
      uVar12 = uVar8;
      for (uVar16 = uVar11; -1 < (int)uVar16; uVar16 = (ulong)((int)uVar16 - 1)) {
        if (thresh[uVar16] <= auVar17._12_4_ + auVar17._8_4_ + auVar28._0_4_) goto LAB_0020d342;
        uVar12 = uVar12 - 1;
      }
      uVar12 = 0;
LAB_0020d342:
      auVar17 = pmovzxbd(auVar28,*(undefined4 *)weightedColors[uVar12].m_c);
      auVar25._0_4_ = auVar17._0_4_ - auVar24._0_4_;
      auVar25._4_4_ = auVar17._4_4_ - auVar24._4_4_;
      auVar25._8_4_ = auVar17._8_4_ - auVar24._8_4_;
      auVar25._12_4_ = auVar17._12_4_ - auVar24._12_4_;
      auVar24 = pmulld(auVar25,auVar19);
      auVar24 = pmulld(auVar24,auVar25);
      auVar24 = phaddd(auVar24,auVar24);
      auVar21 = phaddd(auVar24,auVar24);
      uVar9 = uVar9 + auVar21._0_4_;
      uVar10 = uVar10 + 1;
    } while (uVar9 <= best_err_so_far);
  }
  else {
    uVar9 = 0;
    uVar10 = 0;
    do {
      if (uVar10 == num_pixels) {
        return uVar9;
      }
      uVar16 = uVar8;
      for (uVar12 = uVar11; -1 < (int)uVar12; uVar12 = (ulong)((int)uVar12 - 1)) {
        if (thresh[uVar12] <=
            (int)(auVar18._8_4_ * (uint)pPixels[uVar10].m_c[2] +
                 auVar18._4_4_ * (uint)pPixels[uVar10].m_c[1] +
                 auVar18._0_4_ * (uint)pPixels[uVar10].m_c[0])) goto LAB_0020d4a6;
        uVar16 = uVar16 - 1;
      }
      uVar16 = 0;
LAB_0020d4a6:
      iVar15 = (uint)weightedColors[uVar16].m_c[0] - (uint)pPixels[uVar10].m_c[0];
      iVar14 = (uint)weightedColors[uVar16].m_c[1] - (uint)pPixels[uVar10].m_c[1];
      iVar13 = (uint)weightedColors[uVar16].m_c[2] - (uint)pPixels[uVar10].m_c[2];
      uVar9 = uVar9 + (uint)(iVar13 * auVar19._8_4_ * iVar13 +
                            iVar14 * auVar19._4_4_ * iVar14 + iVar15 * auVar19._0_4_ * iVar15);
      uVar10 = uVar10 + 1;
    } while (uVar9 <= best_err_so_far);
  }
  return uVar9;
}

Assistant:

uint64_t color_cell_compression_est_astc(
	uint32_t num_weights, uint32_t num_comps, const uint32_t *pWeight_table,
	uint32_t num_pixels, const color_quad_u8* pPixels, 
	uint64_t best_err_so_far, const uint32_t weights[4])
{
	assert(num_comps == 3 || num_comps == 4);
	assert(num_weights >= 1 && num_weights <= 32);
	assert(pWeight_table[0] == 0 && pWeight_table[num_weights - 1] == 64);

	// Find RGB bounds as an approximation of the block's principle axis
	uint32_t lr = 255, lg = 255, lb = 255, la = 255;
	uint32_t hr = 0, hg = 0, hb = 0, ha = 0;
	if (num_comps == 4)
	{
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8* pC = &pPixels[i];
			if (pC->m_c[0] < lr) lr = pC->m_c[0];
			if (pC->m_c[1] < lg) lg = pC->m_c[1];
			if (pC->m_c[2] < lb) lb = pC->m_c[2];
			if (pC->m_c[3] < la) la = pC->m_c[3];

			if (pC->m_c[0] > hr) hr = pC->m_c[0];
			if (pC->m_c[1] > hg) hg = pC->m_c[1];
			if (pC->m_c[2] > hb) hb = pC->m_c[2];
			if (pC->m_c[3] > ha) ha = pC->m_c[3];
		}
	}
	else
	{
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8* pC = &pPixels[i];
			if (pC->m_c[0] < lr) lr = pC->m_c[0];
			if (pC->m_c[1] < lg) lg = pC->m_c[1];
			if (pC->m_c[2] < lb) lb = pC->m_c[2];

			if (pC->m_c[0] > hr) hr = pC->m_c[0];
			if (pC->m_c[1] > hg) hg = pC->m_c[1];
			if (pC->m_c[2] > hb) hb = pC->m_c[2];
		}
		la = 255;
		ha = 255;
	}

	color_quad_u8 lowColor, highColor;
	color_quad_u8_set(&lowColor, lr, lg, lb, la);
	color_quad_u8_set(&highColor, hr, hg, hb, ha);

	// Place endpoints at bbox diagonals and compute interpolated colors 
	color_quad_u8 weightedColors[32];

	weightedColors[0] = lowColor;
	weightedColors[num_weights - 1] = highColor;
	for (uint32_t i = 1; i < (num_weights - 1); i++)
	{
		weightedColors[i].m_c[0] = (uint8_t)astc_interpolate_linear(lowColor.m_c[0], highColor.m_c[0], pWeight_table[i]);
		weightedColors[i].m_c[1] = (uint8_t)astc_interpolate_linear(lowColor.m_c[1], highColor.m_c[1], pWeight_table[i]);
		weightedColors[i].m_c[2] = (uint8_t)astc_interpolate_linear(lowColor.m_c[2], highColor.m_c[2], pWeight_table[i]);
		weightedColors[i].m_c[3] = (num_comps == 4) ? (uint8_t)astc_interpolate_linear(lowColor.m_c[3], highColor.m_c[3], pWeight_table[i]) : 255;
	}

	// Compute dots and thresholds
	const int ar = highColor.m_c[0] - lowColor.m_c[0];
	const int ag = highColor.m_c[1] - lowColor.m_c[1];
	const int ab = highColor.m_c[2] - lowColor.m_c[2];
	const int aa = highColor.m_c[3] - lowColor.m_c[3];

	int dots[32];
	if (num_comps == 4)
	{
		for (uint32_t i = 0; i < num_weights; i++)
			dots[i] = weightedColors[i].m_c[0] * ar + weightedColors[i].m_c[1] * ag + weightedColors[i].m_c[2] * ab + weightedColors[i].m_c[3] * aa;
	}
	else
	{
		assert(aa == 0);
		for (uint32_t i = 0; i < num_weights; i++)
			dots[i] = weightedColors[i].m_c[0] * ar + weightedColors[i].m_c[1] * ag + weightedColors[i].m_c[2] * ab;
	}

	int thresh[32 - 1];
	for (uint32_t i = 0; i < (num_weights - 1); i++)
		thresh[i] = (dots[i] + dots[i + 1] + 1) >> 1;

	uint64_t total_err = 0;
	if ((weights[0] | weights[1] | weights[2] | weights[3]) == 1)
	{
		if (num_comps == 4)
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2] + aa * pC->m_c[3];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];
				int da = (int)pE1->m_c[3] - (int)pC->m_c[3];

				total_err += (dr * dr) + (dg * dg) + (db * db) + (da * da);
				if (total_err > best_err_so_far)
					break;
			}
		}
		else
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];

				total_err += (dr * dr) + (dg * dg) + (db * db);
				if (total_err > best_err_so_far)
					break;
			}
		}
	}
	else
	{
		if (num_comps == 4)
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2] + aa * pC->m_c[3];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];
				int da = (int)pE1->m_c[3] - (int)pC->m_c[3];

				total_err += weights[0] * (dr * dr) + weights[1] * (dg * dg) + weights[2] * (db * db) + weights[3] * (da * da);
				if (total_err > best_err_so_far)
					break;
			}
		}
		else
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];

				total_err += weights[0] * (dr * dr) + weights[1] * (dg * dg) + weights[2] * (db * db);
				if (total_err > best_err_so_far)
					break;
			}
		}
	}

	return total_err;
}